

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# di.hpp
# Opt level: O0

void __thiscall
boost::ext::di::v1_3_0::core::binder::operator()
          (injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_int,_int,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,_i1,_impl1,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>_>
           *deps)

{
  injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_int,_int,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,_i1,_impl1,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>_>
  *in_stack_ffffffffffffffe8;
  
  operator()(in_stack_ffffffffffffffe8,
             (type<boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,_c_uniform,_c_uniform,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>_>
              *)0x120588);
  return;
}

Assistant:

static decltype(auto) resolve(TDeps* deps) noexcept {
    using dependency = dependency_concept<aux::decay_t<T>, TName>;
#if (defined(__CLANG__) && __CLANG__ >= 3'9)  //
    return resolve_(deps, aux::type<decltype(resolve_impl<TDefault, dependency>(aux::declval<TDeps*>()))>{});
#else
    return resolve_impl<TDefault, dependency>(deps);
#endif
  }